

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O1

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_sub>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  uint uVar4;
  undefined1 (*pauVar5) [32];
  int iVar6;
  uint uVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [32];
  uint uVar11;
  long lVar12;
  
  iVar1 = a->c;
  if (0 < (long)iVar1) {
    uVar4 = a->h * a->w * a->d * a->elempack;
    lVar8 = 0;
    do {
      pauVar9 = (undefined1 (*) [32])(a->cstep * lVar8 * a->elemsize + (long)a->data);
      pauVar10 = (undefined1 (*) [32])(b->cstep * lVar8 * b->elemsize + (long)b->data);
      pauVar5 = (undefined1 (*) [32])(c->cstep * lVar8 * c->elemsize + (long)c->data);
      if ((int)uVar4 < 8) {
        uVar11 = 0;
      }
      else {
        iVar6 = 7;
        do {
          auVar3 = vsubps_avx(*pauVar9,*pauVar10);
          *pauVar5 = auVar3;
          pauVar9 = pauVar9 + 1;
          pauVar10 = pauVar10 + 1;
          pauVar5 = pauVar5 + 1;
          iVar6 = iVar6 + 8;
          uVar11 = uVar4 & 0xfffffff8;
        } while (iVar6 < (int)uVar4);
      }
      uVar7 = uVar11 | 3;
      while ((int)uVar7 < (int)uVar4) {
        auVar2 = vsubps_avx(*(undefined1 (*) [16])*pauVar9,*(undefined1 (*) [16])*pauVar10);
        *(undefined1 (*) [16])*pauVar5 = auVar2;
        pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        pauVar5 = (undefined1 (*) [32])(*pauVar5 + 0x10);
        uVar7 = uVar11 + 7;
        uVar11 = uVar11 + 4;
      }
      if (uVar4 - uVar11 != 0 && (int)uVar11 <= (int)uVar4) {
        lVar12 = 0;
        do {
          *(float *)(*pauVar5 + lVar12 * 4) =
               *(float *)(*pauVar9 + lVar12 * 4) - *(float *)(*pauVar10 + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (uVar4 - uVar11 != (int)lVar12);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar1);
  }
  return iVar1;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}